

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::ipc::HostImpl::HostImpl(HostImpl *this,char *socket_name,TaskRunner *task_runner)

{
  _Rb_tree_header *p_Var1;
  uint __errnum;
  UnixSocket *this_00;
  UnixSocket *pUVar2;
  char *fname;
  uint *puVar3;
  char *pcVar4;
  allocator<char> local_49;
  UnixSocket *local_48;
  string local_40;
  
  (this->super_Host)._vptr_Host = (_func_int **)&PTR__HostImpl_003c9b60;
  (this->super_EventListener)._vptr_EventListener = (_func_int **)&PTR__HostImpl_003c9ba8;
  this->task_runner_ = task_runner;
  p_Var1 = &(this->services_)._M_t._M_impl.super__Rb_tree_header;
  (this->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->services_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->clients_)._M_t._M_impl.super__Rb_tree_header;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->services_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sock_)._M_t.
  super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
  .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl = (UnixSocket *)0x0;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header;
  (this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->clients_by_socket_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->last_service_id_ = 0;
  this->last_client_id_ = 0;
  base::WeakPtrFactory<perfetto::ipc::HostImpl>::WeakPtrFactory(&this->weak_ptr_factory_,this);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,socket_name,&local_49);
  base::UnixSocket::Listen
            ((UnixSocket *)&local_48,&local_40,&this->super_EventListener,this->task_runner_,kUnix,
             kStream);
  pUVar2 = local_48;
  local_48 = (UnixSocket *)0x0;
  this_00 = (this->sock_)._M_t.
            super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
            ._M_t.
            super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
            .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl;
  (this->sock_)._M_t.
  super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
  .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl = pUVar2;
  if (this_00 != (UnixSocket *)0x0) {
    base::UnixSocket::~UnixSocket(this_00);
    operator_delete(this_00,0x40);
  }
  local_48 = (UnixSocket *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((this->sock_)._M_t.
      super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
      ._M_t.
      super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
      .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl == (UnixSocket *)0x0)
  {
    fname = base::Basename(
                          "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                          );
    puVar3 = (uint *)__errno_location();
    __errnum = *puVar3;
    pcVar4 = strerror(__errnum);
    base::LogMessage(kLogError,fname,0x1120b,"Failed to create %s (errno: %d, %s)",socket_name,
                     (ulong)__errnum,pcVar4);
  }
  return;
}

Assistant:

HostImpl::HostImpl(const char* socket_name, base::TaskRunner* task_runner)
    : task_runner_(task_runner), weak_ptr_factory_(this) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  sock_ = base::UnixSocket::Listen(socket_name, this, task_runner_,
                                   kHostSockFamily, base::SockType::kStream);
  if (!sock_) {
    PERFETTO_PLOG("Failed to create %s", socket_name);
  }
}